

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::Diagnostic>::emplace_back<slang::Diagnostic_const&>
          (SmallVectorBase<slang::Diagnostic> *this,Diagnostic *args)

{
  size_type sVar1;
  pointer pDVar2;
  
  if (this->len == this->cap) {
    pDVar2 = emplaceRealloc<slang::Diagnostic_const&>(this,this->data_ + this->len,args);
    return pDVar2;
  }
  Diagnostic::Diagnostic(this->data_ + this->len,args);
  sVar1 = this->len;
  this->len = sVar1 + 1;
  return this->data_ + sVar1;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }